

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O2

date_t __thiscall
duckdb::DateTruncBinaryOperator::Operation<duckdb::string_t,duckdb::timestamp_t,duckdb::date_t>
          (DateTruncBinaryOperator *this,string_t specifier,timestamp_t date)

{
  DatePartSpecifier DVar1;
  bool bVar2;
  date_t dVar3;
  NotImplementedException *this_00;
  timestamp_t input;
  allocator local_69;
  string local_68;
  string local_48;
  string_t specifier_local;
  
  input.value = specifier.value._8_8_;
  specifier_local.value.pointer.ptr = (char *)specifier.value._0_8_;
  specifier_local.value._0_8_ = this;
  string_t::GetString_abi_cxx11_(&local_68,&specifier_local);
  DVar1 = GetDatePartSpecifier(&local_68);
  bVar2 = Value::IsFinite<duckdb::timestamp_t>(input);
  if (bVar2) {
    switch(DVar1) {
    case BEGIN_BIGINT:
      dVar3 = DateTrunc::YearOperator::Operation<duckdb::timestamp_t,duckdb::date_t>(input);
      break;
    case MONTH:
      dVar3 = DateTrunc::MonthOperator::Operation<duckdb::timestamp_t,duckdb::date_t>(input);
      break;
    case DAY:
    case MICROSECONDS:
    case DOW:
    case ISODOW:
    case DOY:
    case JULIAN_DAY:
      dVar3 = Timestamp::GetDate(input);
      break;
    case DECADE:
      dVar3 = DateTrunc::DecadeOperator::Operation<duckdb::timestamp_t,duckdb::date_t>(input);
      break;
    case CENTURY:
      dVar3 = DateTrunc::CenturyOperator::Operation<duckdb::timestamp_t,duckdb::date_t>(input);
      break;
    case MILLENNIUM:
      dVar3 = DateTrunc::MillenniumOperator::Operation<duckdb::timestamp_t,duckdb::date_t>(input);
      break;
    case MILLISECONDS:
      dVar3 = DateTrunc::MillisecondOperator::Operation<duckdb::timestamp_t,duckdb::date_t>(input);
      break;
    case SECOND:
    case BEGIN_DOUBLE:
      dVar3 = DateTrunc::SecondOperator::Operation<duckdb::timestamp_t,duckdb::date_t>(input);
      break;
    case MINUTE:
      dVar3 = DateTrunc::MinuteOperator::Operation<duckdb::timestamp_t,duckdb::date_t>(input);
      break;
    case HOUR:
      dVar3 = DateTrunc::HourOperator::Operation<duckdb::timestamp_t,duckdb::date_t>(input);
      break;
    case WEEK:
    case YEARWEEK:
      dVar3 = DateTrunc::WeekOperator::Operation<duckdb::timestamp_t,duckdb::date_t>(input);
      break;
    case ISOYEAR:
      dVar3 = DateTrunc::ISOYearOperator::Operation<duckdb::timestamp_t,duckdb::date_t>(input);
      break;
    case QUARTER:
      dVar3 = DateTrunc::QuarterOperator::Operation<duckdb::timestamp_t,duckdb::date_t>(input);
      break;
    default:
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_48,"Specifier type not implemented for DATETRUNC",&local_69);
      NotImplementedException::NotImplementedException(this_00,&local_48);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    dVar3 = Cast::Operation<duckdb::timestamp_t,duckdb::date_t>(input);
  }
  ::std::__cxx11::string::~string((string *)&local_68);
  return (date_t)dVar3.days;
}

Assistant:

static inline TR Operation(TA specifier, TB date) {
		return TruncateElement<TB, TR>(GetDatePartSpecifier(specifier.GetString()), date);
	}